

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

bool TestLockPointValidity(CChain *active_chain,LockPoints *lp)

{
  int iVar1;
  CBlockIndex *pCVar2;
  pointer ppCVar3;
  bool bVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  
  pCVar2 = lp->maxInputBlock;
  if (pCVar2 != (CBlockIndex *)0x0) {
    iVar1 = pCVar2->nHeight;
    if ((long)iVar1 < 0) {
LAB_00ac5b6c:
      pCVar5 = (CBlockIndex *)0x0;
    }
    else {
      ppCVar3 = (active_chain->vChain).
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(active_chain->vChain).
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3) <=
          iVar1) goto LAB_00ac5b6c;
      pCVar5 = ppCVar3[iVar1];
    }
    if (pCVar5 != pCVar2) {
      bVar4 = false;
      goto LAB_00ac5b79;
    }
  }
  bVar4 = true;
LAB_00ac5b79:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool TestLockPointValidity(CChain& active_chain, const LockPoints& lp)
{
    AssertLockHeld(cs_main);
    // If there are relative lock times then the maxInputBlock will be set
    // If there are no relative lock times, the LockPoints don't depend on the chain
    if (lp.maxInputBlock) {
        // Check whether active_chain is an extension of the block at which the LockPoints
        // calculation was valid.  If not LockPoints are no longer valid
        if (!active_chain.Contains(lp.maxInputBlock)) {
            return false;
        }
    }

    // LockPoints still valid
    return true;
}